

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O2

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int maybechunked)

{
  undefined1 *puVar1;
  int iVar2;
  size_t sVar3;
  contenc_writer *pcVar4;
  ulong uVar5;
  content_encoding **cep;
  content_encoding **ppcVar6;
  byte *pbVar7;
  content_encoding *ce;
  content_encoding *handler;
  size_t max;
  ulong local_40;
  
  local_40 = 0;
LAB_004ae100:
  while ((uVar5 = (ulong)(byte)*enclist, uVar5 < 0x2d &&
         ((0x100100000200U >> (uVar5 & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  sVar3 = 1;
  max = 0;
  pbVar7 = (byte *)enclist;
  do {
    if (((char)uVar5 != '\t') && (iVar2 = (int)uVar5, iVar2 != 0x20)) {
      if ((iVar2 == 0) || (iVar2 == 0x2c)) break;
      if (3 < (byte)((char)uVar5 - 10U)) {
        max = sVar3;
      }
    }
    uVar5 = (ulong)pbVar7[1];
    pbVar7 = pbVar7 + 1;
    sVar3 = sVar3 + 1;
  } while( true );
  if (max == 7 && maybechunked != 0) {
    iVar2 = Curl_strncasecompare(enclist,"chunked",7);
    if (iVar2 != 0) {
      puVar1 = &(data->req).field_0xd9;
      *puVar1 = *puVar1 | 0x20;
      Curl_httpchunk_init(data);
      goto LAB_004ae254;
    }
  }
  else if (max == 0) goto LAB_004ae254;
  for (ppcVar6 = encodings; handler = *ppcVar6, handler != (content_encoding *)0x0;
      ppcVar6 = ppcVar6 + 1) {
    iVar2 = Curl_strncasecompare(enclist,handler->name,max);
    if (((iVar2 != 0) && (handler->name[max] == '\0')) ||
       ((handler->alias != (char *)0x0 &&
        ((iVar2 = Curl_strncasecompare(enclist,handler->alias,max), iVar2 != 0 &&
         (handler->alias[max] == '\0')))))) goto LAB_004ae1f1;
  }
  handler = &error_encoding;
LAB_004ae1f1:
  pcVar4 = (data->req).writer_stack;
  if (pcVar4 == (contenc_writer *)0x0) {
    pcVar4 = new_unencoding_writer(data,&client_encoding,(contenc_writer *)0x0);
    (data->req).writer_stack = pcVar4;
    if (pcVar4 == (contenc_writer *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  iVar2 = (int)local_40;
  local_40 = (ulong)(iVar2 + 1);
  if (3 < iVar2) {
    Curl_failf(data,"Reject response due to %u content encodings",local_40);
    return CURLE_BAD_CONTENT_ENCODING;
  }
  pcVar4 = new_unencoding_writer(data,handler,pcVar4);
  if (pcVar4 == (contenc_writer *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  (data->req).writer_stack = pcVar4;
LAB_004ae254:
  enclist = (char *)pbVar7;
  if (*pbVar7 == 0) {
    return CURLE_OK;
  }
  goto LAB_004ae100;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int maybechunked)
{
  struct SingleRequest *k = &data->req;
  int counter = 0;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(data);   /* init our chunky engine. */
    }
    else if(namelen) {
      const struct content_encoding *encoding = find_encoding(name, namelen);
      struct contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(data, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      if(++counter >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to %u content encodings",
              counter);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(data, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}